

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::setModel(QTreeView *this,QAbstractItemModel *model)

{
  offset_in_QAbstractItemViewPrivate_to_subr slot;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  SortOrder SVar4;
  QAbstractItemModel *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  Object local_48 [8];
  Object local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  slot = *(offset_in_QAbstractItemViewPrivate_to_subr *)
          &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
           field_0x8;
  pQVar1 = *(QAbstractItemModel **)(slot + 0x2f8);
  if (pQVar1 != model) {
    if (pQVar1 != (QAbstractItemModel *)0x0) {
      pQVar5 = (QAbstractItemModel *)QAbstractItemModelPrivate::staticEmptyModel();
      if (pQVar1 != pQVar5) {
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 8) {
          QObject::disconnect((Connection *)(slot + 0x640 + lVar6));
        }
      }
    }
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)(slot + 800));
    if (bVar2) {
      QObject::disconnect((Connection *)(slot + 0x638));
    }
    QList<QTreeViewItem>::clear((QList<QTreeViewItem> *)(slot + 0x5a0));
    QHash<QPersistentModelIndex,_QHashDummyValue>::clear
              ((QHash<QPersistentModelIndex,_QHashDummyValue> *)(slot + 0x5d8));
    QHash<QPersistentModelIndex,_QHashDummyValue>::clear
              ((QHash<QPersistentModelIndex,_QHashDummyValue> *)(slot + 0x5e8));
    *(undefined1 *)(slot + 0x624) = 1;
    (**(code **)(**(long **)(slot + 0x590) + 0x1c8))(*(long **)(slot + 0x590),model);
    *(undefined1 *)(slot + 0x624) = 0;
    QAbstractItemView::setModel((QAbstractItemView *)this,model);
    if (*(Object **)(slot + 0x2f8) != (Object *)0x0) {
      QObjectPrivate::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemViewPrivate::*)(QModelIndex_const&,int,int)>
                (*(Object **)(slot + 0x2f8),
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::rowsRemoved,(Object *)0x0
                 ,slot);
      QObjectPrivate::
      disconnect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QAbstractItemViewPrivate::*)()>
                (*(Object **)(slot + 0x2f8),
                 (offset_in_QAbstractItemModel_to_subr)QAbstractItemModel::layoutChanged,
                 (Object *)0x0,
                 *(offset_in_QAbstractItemViewPrivate_to_subr *)(*(long *)(slot + 0x590) + 8));
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QTreeView::*)(QModelIndex_const&,int,int)>
                (local_48,*(offset_in_QAbstractItemModel_to_subr *)(slot + 0x2f8),
                 (ContextType *)QAbstractItemModel::rowsRemoved,(offset_in_QTreeView_to_subr *)0x0,
                 (ConnectionType)this);
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QTreeViewPrivate::*)()>
                (local_40,*(offset_in_QAbstractItemModel_to_subr *)(slot + 0x2f8),
                 (Object *)QAbstractItemModel::modelAboutToBeReset,0,(ConnectionType)slot);
      std::array<QMetaObject::Connection,_2UL>::operator=
                ((array<QMetaObject::Connection,_2UL> *)(slot + 0x640),
                 (array<QMetaObject::Connection,_2UL> *)local_48);
      std::array<QMetaObject::Connection,_2UL>::~array
                ((array<QMetaObject::Connection,_2UL> *)local_48);
    }
    if (*(char *)(slot + 0x5c3) == '\x01') {
      iVar3 = QHeaderView::sortIndicatorSection
                        (*(QHeaderView **)
                          (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget.field_0x8 + 0x590));
      SVar4 = QHeaderView::sortIndicatorOrder
                        (*(QHeaderView **)
                          (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget.field_0x8 + 0x590));
      (**(code **)(**(long **)(slot + 0x2f8) + 0x140))(*(long **)(slot + 0x2f8),iVar3,SVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::setModel(QAbstractItemModel *model)
{
    Q_D(QTreeView);
    if (model == d->model)
        return;
    if (d->model && d->model != QAbstractItemModelPrivate::staticEmptyModel()) {
        for (const QMetaObject::Connection &connection : d->modelConnections)
            QObject::disconnect(connection);
    }

    if (d->selectionModel) { // support row editing
        QObject::disconnect(d->selectionmodelConnection);
    }
    d->viewItems.clear();
    d->expandedIndexes.clear();
    d->hiddenIndexes.clear();
    d->geometryRecursionBlock = true;   // do not update geometries due to signals from the headers
    d->header->setModel(model);
    d->geometryRecursionBlock = false;
    QAbstractItemView::setModel(model);

    if (d->model) {
        // QAbstractItemView connects to a private slot
        QObjectPrivate::disconnect(d->model, &QAbstractItemModel::rowsRemoved,
                                   d, &QAbstractItemViewPrivate::rowsRemoved);
        // do header layout after the tree
        QObjectPrivate::disconnect(d->model, &QAbstractItemModel::layoutChanged,
                                   d->header->d_func(), &QAbstractItemViewPrivate::layoutChanged);

        d->modelConnections = {
            // QTreeView has a public slot for this
            QObject::connect(d->model, &QAbstractItemModel::rowsRemoved,
                             this, &QTreeView::rowsRemoved),
            QObjectPrivate::connect(d->model, &QAbstractItemModel::modelAboutToBeReset,
                                    d, &QTreeViewPrivate::modelAboutToBeReset)
        };
    }
    if (d->sortingEnabled)
        d->sortIndicatorChanged(header()->sortIndicatorSection(), header()->sortIndicatorOrder());
}